

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O0

ArrayXZ * __thiscall IMLE::getMultiplePredictionsJacobian(IMLE *this)

{
  reference pFVar1;
  reference piVar2;
  Scalar *pSVar3;
  MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *matrix;
  MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  *this_00;
  long in_RDI;
  Product<Eigen::DiagonalWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1>
  PVar4;
  int k;
  int j_1;
  int j;
  Mat weightedKappa;
  DenseBase<Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1>_>
  *in_stack_fffffffffffff648;
  DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *in_stack_fffffffffffff650;
  MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_fffffffffffff658;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_fffffffffffff660;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  *in_stack_fffffffffffff668;
  LhsNested in_stack_fffffffffffff670;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  *in_stack_fffffffffffff678;
  vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  *in_stack_fffffffffffff680;
  StorageBaseType *in_stack_fffffffffffff690;
  double *in_stack_fffffffffffff698;
  double *in_stack_fffffffffffff6a0;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
  *in_stack_fffffffffffff6a8;
  undefined4 local_78c;
  undefined4 local_f4;
  undefined4 local_7c;
  
  if ((*(byte *)(in_RDI + 0x288) & 1) == 0) {
    std::
    vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
    ::clear((vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
             *)0x3015a8);
    std::
    vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
    ::clear((vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
             *)0x3015bc);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
              ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffff650,
               (Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffff648);
    std::
    vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
    ::resize(in_stack_fffffffffffff680,(size_type)in_stack_fffffffffffff678,
             (value_type *)in_stack_fffffffffffff670.m_diagonal);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x30161b)
    ;
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
              ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffff650,
               (Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffff648);
    std::
    vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
    ::resize(in_stack_fffffffffffff680,(size_type)in_stack_fffffffffffff678,
             (value_type *)in_stack_fffffffffffff670.m_diagonal);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x30168b)
    ;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
               in_stack_fffffffffffff670.m_diagonal,(Index)in_stack_fffffffffffff668,
               (Index)in_stack_fffffffffffff660);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Zero
              ((Index)in_stack_fffffffffffff658,(Index)in_stack_fffffffffffff650);
    Eigen::Matrix<double,-1,-1,0,-1,-1>::
    Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
              ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffff650,
               (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                *)in_stack_fffffffffffff648);
    for (local_7c = 0; local_7c < *(int *)(in_RDI + 200); local_7c = local_7c + 1) {
      pFVar1 = std::
               vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>::
               operator[]((vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                           *)(in_RDI + 0xb0),(long)local_7c);
      LinearExpert::get_p_z(&pFVar1->super_LinearExpert);
      pFVar1 = std::
               vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>::
               operator[]((vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                           *)(in_RDI + 0xb0),(long)local_7c);
      LinearExpert::getKappa(&pFVar1->super_LinearExpert);
      Eigen::operator*(in_stack_fffffffffffff698,in_stack_fffffffffffff690);
      std::vector<int,_std::allocator<int>_>::operator[]
                ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x140),(long)local_7c);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                (in_stack_fffffffffffff660,(Index)in_stack_fffffffffffff658);
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>>::operator+=
                ((MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_> *
                 )in_stack_fffffffffffff670.m_diagonal,in_stack_fffffffffffff668);
    }
    for (local_f4 = 0; PVar4.m_rhs = (RhsNested)in_stack_fffffffffffff668,
        PVar4.m_lhs.m_diagonal = in_stack_fffffffffffff670.m_diagonal,
        local_f4 < *(int *)(in_RDI + 200); local_f4 = local_f4 + 1) {
      pFVar1 = std::
               vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>::
               operator[]((vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                           *)(in_RDI + 0xb0),(long)local_f4);
      LinearExpert::get_p_z(&pFVar1->super_LinearExpert);
      pFVar1 = std::
               vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>::
               operator[]((vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                           *)(in_RDI + 0xb0),(long)local_f4);
      LinearExpert::get_dGamma(&pFVar1->super_LinearExpert);
      Eigen::operator*(in_stack_fffffffffffff698,in_stack_fffffffffffff690);
      std::vector<int,_std::allocator<int>_>::operator[]
                ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x140),(long)local_f4);
      Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                (in_stack_fffffffffffff650,(Index)in_stack_fffffffffffff648);
      pFVar1 = std::
               vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>::
               operator[]((vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                           *)(in_RDI + 0xb0),(long)local_f4);
      LinearExpert::getKappa(&pFVar1->super_LinearExpert);
      Eigen::operator*(in_stack_fffffffffffff698,in_stack_fffffffffffff690);
      Eigen::
      MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>
      ::operator+(in_stack_fffffffffffff678,
                  (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                   *)in_stack_fffffffffffff670.m_diagonal);
      std::vector<int,_std::allocator<int>_>::operator[]
                ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x140),(long)local_f4);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                (in_stack_fffffffffffff660,(Index)in_stack_fffffffffffff658);
      Eigen::
      MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const>>
      ::operator-((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                   *)in_stack_fffffffffffff678,
                  (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                   *)in_stack_fffffffffffff670.m_diagonal);
      Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                (in_stack_fffffffffffff650,(Index)in_stack_fffffffffffff648);
      Eigen::
      MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>const>>
      ::operator/(in_stack_fffffffffffff6a8,in_stack_fffffffffffff6a0);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                (in_stack_fffffffffffff660,(Index)in_stack_fffffffffffff658);
      Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>::operator=
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)
                 in_stack_fffffffffffff650,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                  *)in_stack_fffffffffffff648);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                (in_stack_fffffffffffff660,(Index)in_stack_fffffffffffff658);
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>::
      asDiagonal((MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_> *
                 )in_stack_fffffffffffff650);
      std::vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>::
      operator[]((vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                  *)(in_RDI + 0xb0),(long)local_f4);
      Eigen::
      DiagonalBase<Eigen::DiagonalWrapper<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>const>>
      ::operator*((DiagonalBase<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
                   *)in_stack_fffffffffffff660,in_stack_fffffffffffff658);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                (in_stack_fffffffffffff660,(Index)in_stack_fffffffffffff658);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                (in_stack_fffffffffffff660,(Index)in_stack_fffffffffffff658);
      Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>::
      transpose((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_> *)
                in_stack_fffffffffffff650);
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>>::operator*
                ((MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_> *
                 )in_stack_fffffffffffff660,
                 (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
                  *)in_stack_fffffffffffff658);
      Eigen::
      MatrixBase<Eigen::Product<Eigen::DiagonalWrapper<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>const>,Eigen::Matrix<double,-1,-1,0,-1,-1>,1>>
      ::operator-((MatrixBase<Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1>_>
                   *)in_stack_fffffffffffff678,
                  (MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_0>_>
                   *)in_stack_fffffffffffff670.m_diagonal);
      piVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x140),(long)local_f4);
      std::
      vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
      ::operator[]((vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    *)(in_RDI + 0x220),(long)*piVar2);
      Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::noalias
                ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffff648)
      ;
      Eigen::NoAlias<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::MatrixBase>::operator+=
                ((NoAlias<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::MatrixBase> *)
                 in_stack_fffffffffffff670.m_diagonal,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1>,_const_Eigen::Product<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_0>_>_>
                  *)in_stack_fffffffffffff668);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                (in_stack_fffffffffffff660,(Index)in_stack_fffffffffffff658);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                (in_stack_fffffffffffff660,(Index)in_stack_fffffffffffff658);
      Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>::
      transpose((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_> *)
                in_stack_fffffffffffff650);
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>>::operator*
                ((MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_> *
                 )in_stack_fffffffffffff660,
                 (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
                  *)in_stack_fffffffffffff658);
      piVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x140),(long)local_f4);
      std::
      vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
      ::operator[]((vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    *)(in_RDI + 0x238),(long)*piVar2);
      Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::noalias
                ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffff648)
      ;
      Eigen::NoAlias<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::MatrixBase>::operator+=
                ((NoAlias<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::MatrixBase> *)
                 in_stack_fffffffffffff670.m_diagonal,
                 (MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_0>_>
                  *)in_stack_fffffffffffff668);
    }
    for (local_78c = 0; local_78c < *(int *)(in_RDI + 0x284); local_78c = local_78c + 1) {
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         (in_stack_fffffffffffff650,(Index)in_stack_fffffffffffff648);
      if ((*pSVar3 != 0.0) || (NAN(*pSVar3))) {
        std::
        vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
        ::operator[]((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      *)(in_RDI + 0x1d8),(long)local_78c);
        Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::asDiagonal
                  ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffff648)
        ;
        std::
        vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
        ::operator[]((vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                      *)(in_RDI + 0x238),(long)local_78c);
        Eigen::DiagonalBase<Eigen::DiagonalWrapper<Eigen::Matrix<double,-1,1,0,-1,1>const>>::
        operator*((DiagonalBase<Eigen::DiagonalWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                   *)in_stack_fffffffffffff650,
                  (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffff648
                 );
        std::
        vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
        ::operator[]((vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                      *)(in_RDI + 0x220),(long)local_78c);
        Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::noalias
                  ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                   in_stack_fffffffffffff648);
        Eigen::NoAlias<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::MatrixBase>::operator+=
                  ((NoAlias<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::MatrixBase> *)
                   PVar4.m_lhs.m_diagonal.m_diagonal,
                   (MatrixBase<Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1>_>
                    *)PVar4.m_rhs);
        std::
        vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
        ::operator[]((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      *)(in_RDI + 0x1f0),(long)local_78c);
        Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::asDiagonal
                  ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffff648)
        ;
        std::
        vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
        ::operator[]((vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                      *)(in_RDI + 0x220),(long)local_78c);
        PVar4 = Eigen::DiagonalBase<Eigen::DiagonalWrapper<Eigen::Matrix<double,-1,1,0,-1,1>const>>
                ::operator*((DiagonalBase<Eigen::DiagonalWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                             *)in_stack_fffffffffffff650,
                            (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                            in_stack_fffffffffffff648);
        matrix = (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                 std::
                 vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
                 ::operator[]((vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                               *)(in_RDI + 0x220),(long)local_78c);
        Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
                  ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffff650,
                   (DenseBase<Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1>_>
                    *)in_stack_fffffffffffff648);
        this_00 = (MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                   *)std::
                     vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
                     ::operator[]((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                   *)(in_RDI + 0x1f0),(long)local_78c);
        Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::cwiseAbs2
                  ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)PVar4.m_rhs);
        Eigen::
        MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
        ::asDiagonal(this_00);
        in_stack_fffffffffffff650 =
             (DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
             std::
             vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
             ::operator[]((vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                           *)(in_RDI + 0x238),(long)local_78c);
        Eigen::
        DiagonalBase<Eigen::DiagonalWrapper<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>const>>
        ::operator*((DiagonalBase<Eigen::DiagonalWrapper<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                     *)PVar4.m_rhs,matrix);
        in_stack_fffffffffffff648 =
             (DenseBase<Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1>_>
              *)std::
                vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
                ::operator[]((vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                              *)(in_RDI + 0x238),(long)local_78c);
        Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
                  ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffff650,
                   in_stack_fffffffffffff648);
      }
      else {
        std::
        vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
        ::operator[]((vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                      *)(in_RDI + 0x220),(long)local_78c);
        Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::operator=
                  ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffff650,
                   (Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffff648);
        std::
        vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
        ::operator[]((vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                      *)(in_RDI + 0x238),(long)local_78c);
        Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::operator=
                  ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffff650,
                   (Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffff648);
      }
    }
    *(undefined1 *)(in_RDI + 0x288) = 1;
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x3021e8)
    ;
  }
  return (ArrayXZ *)(in_RDI + 0x220);
}

Assistant:

IMLE_CLASS_TEMPLATE
IMLE_TYPENAME IMLE_base::ArrayXZ const &IMLE_base::getMultiplePredictionsJacobian()
{
    if( !hasPredJacobian )
    {
        predictionsJacobian.clear();
        predictionsVarJacobian.clear();
        predictionsJacobian.resize(nSolFound, zeroXZ);
        predictionsVarJacobian.resize(nSolFound, zeroXZ);
        zeta.resize(d,M);

        Mat weightedKappa = Mat::Zero(d,nSolFound);
        for( int j = 0; j < M; j++ )
            weightedKappa.col(sNearest[j]) += experts[j].get_p_z() * experts[j].getKappa();

        for( int j = 0; j < M; j++ )
        {
            zeta.col(j) = (experts[j].get_p_z() * experts[j].get_dGamma() + sumW(sNearest[j]) * experts[j].getKappa() - weightedKappa.col(sNearest[j])) / varPhiAuxj(j);

            predictionsJacobian[sNearest[j]].noalias() += fInvRj.col(j).asDiagonal() * experts[j].Lambda - invRxj.col(j) * zeta.col(j).transpose();
            predictionsVarJacobian[sNearest[j]].noalias() += fInvRj.col(j) * zeta.col(j).transpose();
        }

        for( int k = 0; k < nSolFound; k++ )
            if(sum_p_z(k) == 0.0)  // Not likely, but...
            {
                predictionsJacobian[k] = zeroXZ;
                predictionsVarJacobian[k] = infinityXZ;
            }
            else
            {
                predictionsJacobian[k].noalias() += predictions[k].asDiagonal() * predictionsVarJacobian[k];
                predictionsJacobian[k] = predictionsVar[k].asDiagonal() * predictionsJacobian[k];
                predictionsVarJacobian[k] = predictionsVar[k].cwiseAbs2().asDiagonal() * predictionsVarJacobian[k];
            }

        hasPredJacobian = true;
    }

    return predictionsJacobian;
}